

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O3

void test_obj(float id,Am_Object *result,Am_Object *expected)

{
  char cVar1;
  uint uVar2;
  long *plVar3;
  ostream *poVar4;
  
  test_counter = test_counter + 1;
  if (suppress_successful == 0) {
    printf("%f     ",(double)id);
  }
  else {
    uVar2 = test_counter * -0x3d70a3d7 + 0x51eb850;
    if ((uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f) < 0x51eb851) {
      printf("Test %d\n");
    }
  }
  cVar1 = Am_Object::operator==(result,expected);
  if (cVar1 == '\0') {
    poVar4 = std::ostream::_M_insert<double>((double)id);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"       expected ",0x10);
    poVar4 = (ostream *)operator<<(poVar4,expected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", result is ",0xc);
    plVar3 = (long *)operator<<(poVar4,result);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"*** TEST DID NOT SUCCEED. ***",0x1d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    failed_tests = failed_tests + 1;
  }
  else if (suppress_successful == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  result is ",0xc);
    plVar3 = (long *)operator<<((ostream *)&std::cout,result);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void
test_obj(float id, Am_Object result, Am_Object expected)
{
  ++test_counter;
  if (suppress_successful) {
    if ((test_counter % 50) == 0)
      printf("Test %d\n", test_counter);
  } else
    printf("%f     ", id);

  if (result == expected) {
    if (!suppress_successful)
      cout << "  result is " << result << endl;
  } else {
    cout << id << "       expected " << expected << ", result is " << result
         << endl
         << "*** TEST DID NOT SUCCEED. ***" << endl;
    ++failed_tests;
  }
}